

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int64_t archive_read_format_rar_seek_data(archive_read *a,int64_t offset,int whence)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int64_t iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *fmt;
  uint uVar10;
  
  pbVar2 = (byte *)a->format->data;
  if (pbVar2[0x17] == 0x30) {
    if (whence == 1) {
      lVar5 = 200;
LAB_003cc16a:
      lVar5 = *(long *)(pbVar2 + lVar5);
    }
    else {
      if (whence == 2) {
        lVar5 = 0x28;
        goto LAB_003cc16a;
      }
      lVar5 = 0;
    }
    lVar5 = lVar5 + offset;
    if (lVar5 < 0) {
      return -1;
    }
    if (*(long *)(pbVar2 + 0x28) < lVar5) {
      *(long *)(pbVar2 + 200) = lVar5;
      lVar5 = *(long *)(pbVar2 + 0x28);
    }
    lVar9 = *(long *)(pbVar2 + 0x100);
    lVar5 = lVar5 + *(long *)(lVar9 + 8);
    if ((ulong)*(uint *)(pbVar2 + 0x108) != 0) {
      lVar8 = 0;
      do {
        lVar5 = (lVar5 + *(long *)(lVar9 + 0x20 + lVar8)) - *(long *)(lVar9 + 0x10 + lVar8);
        lVar8 = lVar8 + 0x18;
      } while ((ulong)*(uint *)(pbVar2 + 0x108) * 0x18 != lVar8);
    }
    if ((*pbVar2 & 1) != 0) {
      do {
        while( true ) {
          lVar9 = *(long *)(pbVar2 + 0x100);
          uVar1 = *(uint *)(pbVar2 + 0x108);
          lVar8 = *(long *)(lVar9 + 8 + (ulong)uVar1 * 0x18);
          if ((lVar5 < lVar8) && ((pbVar2[0x18] & 1) != 0)) break;
          lVar8 = *(long *)(lVar9 + 0x10 + (ulong)uVar1 * 0x18);
          if ((lVar5 - lVar8 == 0 || lVar5 < lVar8) || ((pbVar2[0x18] & 2) == 0)) goto LAB_003cc1d6;
          uVar10 = uVar1 + 1;
          *(uint *)(pbVar2 + 0x108) = uVar10;
          if ((uVar10 < *(uint *)(pbVar2 + 0x10c)) &&
             (*(long *)(lVar9 + 0x10 + (ulong)uVar10 * 0x18) < lVar5)) {
            lVar5 = (lVar5 - lVar8) + *(long *)(lVar9 + (ulong)uVar10 * 0x18 + 8);
          }
          else {
            *(uint *)(pbVar2 + 0x108) = uVar1;
            iVar6 = __archive_read_seek(a,lVar8,0);
            if (iVar6 < 0) {
              return iVar6;
            }
            iVar4 = archive_read_format_rar_read_header(a,a->entry);
            if (iVar4 == 1) {
              pbVar2[0xfc] = 1;
              iVar4 = archive_read_format_rar_read_header(a,a->entry);
            }
            if (iVar4 != 0) goto LAB_003cc3a1;
            lVar5 = (lVar5 + *(long *)(*(long *)(pbVar2 + 0x100) + 8 +
                                      (ulong)*(uint *)(pbVar2 + 0x108) * 0x18)) -
                    *(long *)(*(long *)(pbVar2 + 0x100) + 0x10 +
                             (ulong)(*(uint *)(pbVar2 + 0x108) - 1) * 0x18);
          }
        }
        if (uVar1 == 0) {
          fmt = "Attempt to seek past beginning of RAR data block";
          goto LAB_003cc14a;
        }
        uVar7 = (ulong)(uVar1 - 1);
        *(uint *)(pbVar2 + 0x108) = uVar1 - 1;
        lVar3 = *(long *)(lVar9 + 8 + uVar7 * 0x18);
        lVar5 = lVar5 + (*(long *)(lVar9 + 0x10 + uVar7 * 0x18) - lVar8);
      } while (lVar5 < lVar3);
      iVar6 = __archive_read_seek(a,lVar3 - *(long *)(lVar9 + uVar7 * 0x18),0);
      if (iVar6 < 0) {
        return iVar6;
      }
      iVar4 = archive_read_format_rar_read_header(a,a->entry);
      if (iVar4 != 0) {
LAB_003cc3a1:
        fmt = "Error during seek of RAR file";
        goto LAB_003cc14a;
      }
      *(int *)(pbVar2 + 0x108) = *(int *)(pbVar2 + 0x108) + -1;
    }
LAB_003cc1d6:
    iVar6 = __archive_read_seek(a,lVar5,0);
    if (-1 < iVar6) {
      lVar5 = *(long *)(pbVar2 + 0x100);
      uVar7 = (ulong)*(uint *)(pbVar2 + 0x108);
      *(long *)(pbVar2 + 0xa8) = *(long *)(lVar5 + 0x10 + uVar7 * 0x18) - iVar6;
      if (uVar7 != 0) {
        lVar9 = uVar7 * 0x18;
        do {
          iVar6 = (iVar6 - *(long *)(lVar5 + 8 + lVar9)) + *(long *)(lVar5 + -8 + lVar9);
          lVar9 = lVar9 + -0x18;
        } while (lVar9 != 0);
      }
      lVar5 = iVar6 - *(long *)(lVar5 + 8);
      __archive_reset_read_data(&a->archive);
      pbVar2[0xa0] = 0;
      pbVar2[0xa1] = 0;
      pbVar2[0xa2] = 0;
      pbVar2[0xa3] = 0;
      pbVar2[0xa4] = 0;
      pbVar2[0xa5] = 0;
      pbVar2[0xa6] = 0;
      pbVar2[0xa7] = 0;
      pbVar2[0xb8] = 0;
      pbVar2[0xb9] = 0;
      pbVar2[0xba] = 0;
      pbVar2[0xbb] = 0;
      pbVar2[0xbc] = 0;
      pbVar2[0xbd] = 0;
      pbVar2[0xbe] = 0;
      pbVar2[0xbf] = 0;
      if ((lVar5 != *(long *)(pbVar2 + 0x28)) ||
         (iVar6 = *(long *)(pbVar2 + 200), *(long *)(pbVar2 + 200) <= *(long *)(pbVar2 + 0x28))) {
        *(long *)(pbVar2 + 200) = lVar5;
        iVar6 = lVar5;
      }
    }
  }
  else {
    fmt = "Seeking of compressed RAR files is unsupported";
LAB_003cc14a:
    archive_set_error(&a->archive,-1,fmt);
    iVar6 = -0x19;
  }
  return iVar6;
}

Assistant:

static int64_t
archive_read_format_rar_seek_data(struct archive_read *a, int64_t offset,
    int whence)
{
  int64_t client_offset, ret;
  unsigned int i;
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->compression_method == COMPRESS_METHOD_STORE)
  {
    /* Modify the offset for use with SEEK_SET */
    switch (whence)
    {
      case SEEK_CUR:
        client_offset = rar->offset_seek;
        break;
      case SEEK_END:
        client_offset = rar->unp_size;
        break;
      case SEEK_SET:
      default:
        client_offset = 0;
    }
    client_offset += offset;
    if (client_offset < 0)
    {
      /* Can't seek past beginning of data block */
      return -1;
    }
    else if (client_offset > rar->unp_size)
    {
      /*
       * Set the returned offset but only seek to the end of
       * the data block.
       */
      rar->offset_seek = client_offset;
      client_offset = rar->unp_size;
    }

    client_offset += rar->dbo[0].start_offset;
    i = 0;
    while (i < rar->cursor)
    {
      i++;
      client_offset += rar->dbo[i].start_offset - rar->dbo[i-1].end_offset;
    }
    if (rar->main_flags & MHD_VOLUME)
    {
      /* Find the appropriate offset among the multivolume archive */
      while (1)
      {
        if (client_offset < rar->dbo[rar->cursor].start_offset &&
          rar->file_flags & FHD_SPLIT_BEFORE)
        {
          /* Search backwards for the correct data block */
          if (rar->cursor == 0)
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Attempt to seek past beginning of RAR data block");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          client_offset -= rar->dbo[rar->cursor+1].start_offset -
            rar->dbo[rar->cursor].end_offset;
          if (client_offset < rar->dbo[rar->cursor].start_offset)
            continue;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor].header_size, SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          break;
        }
        else if (client_offset > rar->dbo[rar->cursor].end_offset &&
          rar->file_flags & FHD_SPLIT_AFTER)
        {
          /* Search forward for the correct data block */
          rar->cursor++;
          if (rar->cursor < rar->nodes &&
            client_offset > rar->dbo[rar->cursor].end_offset)
          {
            client_offset += rar->dbo[rar->cursor].start_offset -
              rar->dbo[rar->cursor-1].end_offset;
            continue;
          }
          rar->cursor--;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].end_offset,
                                    SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret == (ARCHIVE_EOF))
          {
            rar->has_endarc_header = 1;
            ret = archive_read_format_rar_read_header(a, a->entry);
          }
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          client_offset += rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor-1].end_offset;
          continue;
        }
        break;
      }
    }

    ret = __archive_read_seek(a, client_offset, SEEK_SET);
    if (ret < (ARCHIVE_OK))
      return ret;
    rar->bytes_remaining = rar->dbo[rar->cursor].end_offset - ret;
    i = rar->cursor;
    while (i > 0)
    {
      i--;
      ret -= rar->dbo[i+1].start_offset - rar->dbo[i].end_offset;
    }
    ret -= rar->dbo[0].start_offset;

    /* Always restart reading the file after a seek */
    __archive_reset_read_data(&a->archive);

    rar->bytes_unconsumed = 0;
    rar->offset = 0;

    /*
     * If a seek past the end of file was requested, return the requested
     * offset.
     */
    if (ret == rar->unp_size && rar->offset_seek > rar->unp_size)
      return rar->offset_seek;

    /* Return the new offset */
    rar->offset_seek = ret;
    return rar->offset_seek;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
      "Seeking of compressed RAR files is unsupported");
  }
  return (ARCHIVE_FAILED);
}